

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O2

Vec_Int_t ** Ssw_TransformPairsIntoTempClasses(Vec_Int_t *vPairs,int nObjNumMax)

{
  uint uVar1;
  uint *puVar2;
  uint Entry;
  uint uVar3;
  int iVar4;
  Vec_Int_t **ppVVar5;
  void *__ptr;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  
  ppVVar5 = (Vec_Int_t **)calloc((long)nObjNumMax,8);
  __ptr = malloc((long)nObjNumMax * 4);
  uVar6 = 0;
  uVar8 = (ulong)(uint)nObjNumMax;
  if (nObjNumMax < 1) {
    uVar8 = uVar6;
  }
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    *(undefined4 *)((long)__ptr + uVar6 * 4) = 0xffffffff;
  }
  iVar10 = 0;
  do {
    if (vPairs->nSize <= iVar10) {
      free(__ptr);
      return ppVVar5;
    }
    Entry = Vec_IntEntry(vPairs,iVar10);
    uVar3 = Vec_IntEntry(vPairs,iVar10 + 1);
    if ((int)uVar3 < 1) {
      __assert_fail("idObj > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                    ,0xa5,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
    }
    lVar9 = (long)(int)Entry;
    uVar1 = *(uint *)((long)__ptr + lVar9 * 4);
    uVar8 = (ulong)uVar3;
    if ((ulong)uVar1 == 0xffffffff) {
      uVar11 = *(uint *)((long)__ptr + uVar8 * 4);
      if (uVar11 != 0xffffffff) goto LAB_004eb8c9;
      pVVar7 = Vec_IntAlloc(4);
      ppVVar5[lVar9] = pVVar7;
      Vec_IntPush(pVVar7,Entry);
      Vec_IntPush(pVVar7,uVar3);
      *(uint *)((long)__ptr + lVar9 * 4) = Entry;
      *(uint *)((long)__ptr + uVar8 * 4) = Entry;
    }
    else {
      if (ppVVar5[(int)uVar1] == (Vec_Int_t *)0x0) {
        __assert_fail("(pReprs[idRepr] == -1) || (pvClasses[pReprs[idRepr]] != NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                      ,0xa6,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
      }
      uVar11 = *(uint *)((long)__ptr + uVar8 * 4);
      if (uVar11 == 0xffffffff) {
        uVar11 = 0xffffffff;
        if (-1 < (int)uVar1) {
          Vec_IntPushUniqueOrder(ppVVar5[uVar1],uVar3);
          *(uint *)((long)__ptr + uVar8 * 4) = uVar1;
          goto LAB_004eba9b;
        }
      }
      else {
LAB_004eb8c9:
        pVVar7 = ppVVar5[(int)uVar11];
        if (pVVar7 == (Vec_Int_t *)0x0) {
          __assert_fail("(pReprs[idObj] == -1) || (pvClasses[pReprs[idObj] ] != NULL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                        ,0xa7,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
        }
        if ((uVar1 == 0xffffffff) && (-1 < (int)uVar11)) {
          if (uVar11 == Entry) {
            __assert_fail("idReprObj != idRepr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswPairs.c"
                          ,0xbd,"Vec_Int_t **Ssw_TransformPairsIntoTempClasses(Vec_Int_t *, int)");
          }
          if ((int)uVar11 < (int)Entry) {
            Vec_IntPushUniqueOrder(pVVar7,Entry);
            *(uint *)((long)__ptr + lVar9 * 4) = uVar11;
          }
          else {
            uVar3 = pVVar7->nSize;
            if (uVar3 == pVVar7->nCap) {
              iVar10 = uVar3 * 2;
              if ((int)uVar3 < 0x10) {
                iVar10 = 0x10;
              }
              Vec_IntGrow(pVVar7,iVar10);
              uVar3 = pVVar7->nSize;
            }
            pVVar7->nSize = uVar3 + 1;
            puVar2 = (uint *)pVVar7->pArray;
            for (uVar8 = (ulong)uVar3; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
              puVar2[uVar8] = puVar2[uVar8 - 1];
            }
            *puVar2 = Entry;
            ppVVar5[lVar9] = pVVar7;
            ppVVar5[uVar11] = (Vec_Int_t *)0x0;
            pVVar7 = ppVVar5[lVar9];
            for (iVar10 = 0; iVar10 < pVVar7->nSize; iVar10 = iVar10 + 1) {
              iVar4 = Vec_IntEntry(pVVar7,iVar10);
              *(uint *)((long)__ptr + (long)iVar4 * 4) = Entry;
            }
          }
          goto LAB_004eba9b;
        }
      }
      if (uVar1 != uVar11) {
        if ((int)uVar1 < (int)uVar11) {
          pVVar7 = ppVVar5[(int)uVar11];
          for (iVar10 = 0; iVar10 < pVVar7->nSize; iVar10 = iVar10 + 1) {
            iVar4 = Vec_IntEntry(pVVar7,iVar10);
            Vec_IntPushUniqueOrder(ppVVar5[(int)uVar1],iVar4);
            *(uint *)((long)__ptr + (long)iVar4 * 4) = uVar1;
          }
          Vec_IntFree(pVVar7);
          ppVVar5[(int)uVar11] = (Vec_Int_t *)0x0;
        }
        else {
          pVVar7 = ppVVar5[(int)uVar1];
          for (iVar10 = 0; iVar10 < pVVar7->nSize; iVar10 = iVar10 + 1) {
            iVar4 = Vec_IntEntry(pVVar7,iVar10);
            Vec_IntPushUniqueOrder(ppVVar5[(int)uVar11],iVar4);
            *(uint *)((long)__ptr + (long)iVar4 * 4) = uVar11;
          }
          Vec_IntFree(pVVar7);
          ppVVar5[(int)uVar1] = (Vec_Int_t *)0x0;
        }
      }
    }
LAB_004eba9b:
    iVar10 = iVar10 + 2;
  } while( true );
}

Assistant:

Vec_Int_t ** Ssw_TransformPairsIntoTempClasses( Vec_Int_t * vPairs, int nObjNumMax )
{
    Vec_Int_t ** pvClasses;   // vector of classes
    int * pReprs;             // mapping nodes into their representatives
    int Entry, idObj, idRepr, idReprObj, idReprRepr, i;
    // allocate data-structures
    pvClasses = ABC_CALLOC( Vec_Int_t *, nObjNumMax );
    pReprs    = ABC_ALLOC( int, nObjNumMax );
    for ( i = 0; i < nObjNumMax; i++ )
        pReprs[i] = -1;
    // consider pairs
    for ( i = 0; i < Vec_IntSize(vPairs); i += 2 )
    {
        // get both objects
        idRepr = Vec_IntEntry( vPairs, i   );
        idObj  = Vec_IntEntry( vPairs, i+1 );
        assert( idObj > 0 );
        assert( (pReprs[idRepr] == -1) || (pvClasses[pReprs[idRepr]] != NULL) );
        assert( (pReprs[idObj]  == -1) || (pvClasses[pReprs[idObj] ] != NULL) );
        // get representatives of both objects
        idReprRepr = pReprs[idRepr];
        idReprObj  = pReprs[idObj];
        // check different situations
        if ( idReprRepr == -1 && idReprObj == -1 )
        {   // they do not have classes
            // create a class
            pvClasses[idRepr] = Vec_IntAlloc( 4 );
            Vec_IntPush( pvClasses[idRepr], idRepr );
            Vec_IntPush( pvClasses[idRepr], idObj );
            pReprs[ idRepr ] = idRepr;
            pReprs[ idObj  ] = idRepr;
        }
        else if ( idReprRepr >= 0 && idReprObj == -1 )
        {   // representative has a class
            // add iObj to the same class
            Vec_IntPushUniqueOrder( pvClasses[idReprRepr], idObj );
            pReprs[ idObj ] = idReprRepr;
        }
        else if ( idReprRepr == -1 && idReprObj >= 0 )
        {   // object has a class
            assert( idReprObj != idRepr );
            if ( idReprObj < idRepr )
            { // add idRepr to the same class
                Vec_IntPushUniqueOrder( pvClasses[idReprObj], idRepr );
                pReprs[ idRepr ] = idReprObj;
            }
            else // if ( idReprObj > idRepr )
            { // make idRepr new representative
                Vec_IntPushFirst( pvClasses[idReprObj], idRepr );
                pvClasses[idRepr] = pvClasses[idReprObj];
                pvClasses[idReprObj] = NULL;
                // set correct representatives of each node
                Vec_IntForEachEntry( pvClasses[idRepr], Entry, i )
                    pReprs[ Entry ] = idRepr;
            }
        }
        else // if ( idReprRepr >= 0 && idReprObj >= 0 )
        {   // both have classes
            if ( idReprRepr == idReprObj )
            {  // the classes are the same
                // nothing to do
            }
            else
            {  // the classes are different
                // find the repr of the new class
                if ( idReprRepr < idReprObj )
                {
                    Vec_IntForEachEntry( pvClasses[idReprObj], Entry, i )
                    {
                        Vec_IntPushUniqueOrder( pvClasses[idReprRepr], Entry );
                        pReprs[ Entry ] = idReprRepr;
                    }
                    Vec_IntFree( pvClasses[idReprObj] );
                    pvClasses[idReprObj] = NULL;
                }
                else // if ( idReprRepr > idReprObj )
                {
                    Vec_IntForEachEntry( pvClasses[idReprRepr], Entry, i )
                    {
                        Vec_IntPushUniqueOrder( pvClasses[idReprObj], Entry );
                        pReprs[ Entry ] = idReprObj;
                    }
                    Vec_IntFree( pvClasses[idReprRepr] );
                    pvClasses[idReprRepr] = NULL;
                }
            }
        }
    }
    ABC_FREE( pReprs );
    return pvClasses;
}